

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transformer.cpp
# Opt level: O0

unique_ptr<verilogAST::File,_std::default_delete<verilogAST::File>_> __thiscall
verilogAST::Transformer::visit
          (Transformer *this,
          unique_ptr<verilogAST::File,_std::default_delete<verilogAST::File>_> *node)

{
  bool bVar1;
  pointer pFVar2;
  unique_ptr<verilogAST::File,_std::default_delete<verilogAST::File>_> *in_RDX;
  unique_ptr<verilogAST::AbstractModule,_std::default_delete<verilogAST::AbstractModule>_> local_68;
  value_type local_60;
  reference local_58;
  unique_ptr<verilogAST::AbstractModule,_std::default_delete<verilogAST::AbstractModule>_> *item;
  iterator __end1;
  iterator __begin1;
  vector<std::unique_ptr<verilogAST::AbstractModule,_std::default_delete<verilogAST::AbstractModule>_>,_std::allocator<std::unique_ptr<verilogAST::AbstractModule,_std::default_delete<verilogAST::AbstractModule>_>_>_>
  *__range1;
  vector<std::unique_ptr<verilogAST::AbstractModule,_std::default_delete<verilogAST::AbstractModule>_>,_std::allocator<std::unique_ptr<verilogAST::AbstractModule,_std::default_delete<verilogAST::AbstractModule>_>_>_>
  new_modules;
  unique_ptr<verilogAST::File,_std::default_delete<verilogAST::File>_> *node_local;
  Transformer *this_local;
  
  std::
  vector<std::unique_ptr<verilogAST::AbstractModule,_std::default_delete<verilogAST::AbstractModule>_>,_std::allocator<std::unique_ptr<verilogAST::AbstractModule,_std::default_delete<verilogAST::AbstractModule>_>_>_>
  ::vector((vector<std::unique_ptr<verilogAST::AbstractModule,_std::default_delete<verilogAST::AbstractModule>_>,_std::allocator<std::unique_ptr<verilogAST::AbstractModule,_std::default_delete<verilogAST::AbstractModule>_>_>_>
            *)&__range1);
  pFVar2 = std::unique_ptr<verilogAST::File,_std::default_delete<verilogAST::File>_>::operator->
                     (in_RDX);
  __end1 = std::
           vector<std::unique_ptr<verilogAST::AbstractModule,_std::default_delete<verilogAST::AbstractModule>_>,_std::allocator<std::unique_ptr<verilogAST::AbstractModule,_std::default_delete<verilogAST::AbstractModule>_>_>_>
           ::begin(&pFVar2->modules);
  item = (unique_ptr<verilogAST::AbstractModule,_std::default_delete<verilogAST::AbstractModule>_> *
         )std::
          vector<std::unique_ptr<verilogAST::AbstractModule,_std::default_delete<verilogAST::AbstractModule>_>,_std::allocator<std::unique_ptr<verilogAST::AbstractModule,_std::default_delete<verilogAST::AbstractModule>_>_>_>
          ::end(&pFVar2->modules);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<std::unique_ptr<verilogAST::AbstractModule,_std::default_delete<verilogAST::AbstractModule>_>_*,_std::vector<std::unique_ptr<verilogAST::AbstractModule,_std::default_delete<verilogAST::AbstractModule>_>,_std::allocator<std::unique_ptr<verilogAST::AbstractModule,_std::default_delete<verilogAST::AbstractModule>_>_>_>_>
                                *)&item);
    if (!bVar1) break;
    local_58 = __gnu_cxx::
               __normal_iterator<std::unique_ptr<verilogAST::AbstractModule,_std::default_delete<verilogAST::AbstractModule>_>_*,_std::vector<std::unique_ptr<verilogAST::AbstractModule,_std::default_delete<verilogAST::AbstractModule>_>,_std::allocator<std::unique_ptr<verilogAST::AbstractModule,_std::default_delete<verilogAST::AbstractModule>_>_>_>_>
               ::operator*(&__end1);
    std::unique_ptr<verilogAST::AbstractModule,_std::default_delete<verilogAST::AbstractModule>_>::
    unique_ptr(&local_68,local_58);
    (**(code **)&(node->_M_t).
                 super___uniq_ptr_impl<verilogAST::File,_std::default_delete<verilogAST::File>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_verilogAST::File_*,_std::default_delete<verilogAST::File>_>.
                 super__Head_base<0UL,_verilogAST::File_*,_false>._M_head_impl[10].modules.
                 super__Vector_base<std::unique_ptr<verilogAST::AbstractModule,_std::default_delete<verilogAST::AbstractModule>_>,_std::allocator<std::unique_ptr<verilogAST::AbstractModule,_std::default_delete<verilogAST::AbstractModule>_>_>_>
                 ._M_impl)(&local_60,node,&local_68);
    std::
    vector<std::unique_ptr<verilogAST::AbstractModule,_std::default_delete<verilogAST::AbstractModule>_>,_std::allocator<std::unique_ptr<verilogAST::AbstractModule,_std::default_delete<verilogAST::AbstractModule>_>_>_>
    ::push_back((vector<std::unique_ptr<verilogAST::AbstractModule,_std::default_delete<verilogAST::AbstractModule>_>,_std::allocator<std::unique_ptr<verilogAST::AbstractModule,_std::default_delete<verilogAST::AbstractModule>_>_>_>
                 *)&__range1,&local_60);
    std::unique_ptr<verilogAST::AbstractModule,_std::default_delete<verilogAST::AbstractModule>_>::
    ~unique_ptr(&local_60);
    std::unique_ptr<verilogAST::AbstractModule,_std::default_delete<verilogAST::AbstractModule>_>::
    ~unique_ptr(&local_68);
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<verilogAST::AbstractModule,_std::default_delete<verilogAST::AbstractModule>_>_*,_std::vector<std::unique_ptr<verilogAST::AbstractModule,_std::default_delete<verilogAST::AbstractModule>_>,_std::allocator<std::unique_ptr<verilogAST::AbstractModule,_std::default_delete<verilogAST::AbstractModule>_>_>_>_>
    ::operator++(&__end1);
  }
  pFVar2 = std::unique_ptr<verilogAST::File,_std::default_delete<verilogAST::File>_>::operator->
                     (in_RDX);
  std::
  vector<std::unique_ptr<verilogAST::AbstractModule,_std::default_delete<verilogAST::AbstractModule>_>,_std::allocator<std::unique_ptr<verilogAST::AbstractModule,_std::default_delete<verilogAST::AbstractModule>_>_>_>
  ::operator=(&pFVar2->modules,
              (vector<std::unique_ptr<verilogAST::AbstractModule,_std::default_delete<verilogAST::AbstractModule>_>,_std::allocator<std::unique_ptr<verilogAST::AbstractModule,_std::default_delete<verilogAST::AbstractModule>_>_>_>
               *)&__range1);
  std::unique_ptr<verilogAST::File,_std::default_delete<verilogAST::File>_>::unique_ptr
            ((unique_ptr<verilogAST::File,_std::default_delete<verilogAST::File>_> *)this,in_RDX);
  std::
  vector<std::unique_ptr<verilogAST::AbstractModule,_std::default_delete<verilogAST::AbstractModule>_>,_std::allocator<std::unique_ptr<verilogAST::AbstractModule,_std::default_delete<verilogAST::AbstractModule>_>_>_>
  ::~vector((vector<std::unique_ptr<verilogAST::AbstractModule,_std::default_delete<verilogAST::AbstractModule>_>,_std::allocator<std::unique_ptr<verilogAST::AbstractModule,_std::default_delete<verilogAST::AbstractModule>_>_>_>
             *)&__range1);
  return (__uniq_ptr_data<verilogAST::File,_std::default_delete<verilogAST::File>,_true,_true>)
         (__uniq_ptr_data<verilogAST::File,_std::default_delete<verilogAST::File>,_true,_true>)this;
}

Assistant:

std::unique_ptr<File> Transformer::visit(std::unique_ptr<File> node) {
  std::vector<std::unique_ptr<AbstractModule>> new_modules;
  for (auto&& item : node->modules) {
    new_modules.push_back(this->visit(std::move(item)));
  }
  node->modules = std::move(new_modules);
  return node;
}